

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void merge_new_observations(block_split_stats *stats)

{
  int i;
  block_split_stats *stats_local;
  
  for (i = 0; i < 10; i = i + 1) {
    stats->observations[i] = stats->new_observations[i] + stats->observations[i];
    stats->new_observations[i] = 0;
  }
  stats->num_observations = stats->num_new_observations + stats->num_observations;
  stats->num_new_observations = 0;
  return;
}

Assistant:

static void
merge_new_observations(struct block_split_stats *stats)
{
	int i;

	for (i = 0; i < NUM_OBSERVATION_TYPES; i++) {
		stats->observations[i] += stats->new_observations[i];
		stats->new_observations[i] = 0;
	}
	stats->num_observations += stats->num_new_observations;
	stats->num_new_observations = 0;
}